

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O0

void radixpass_u32(uint32_t *hist,uint32_t shift,uint32_t mask,uint32_t *keys_in,uint32_t *keys_out,
                  uint32_t *values_in,uint32_t *values_out,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t index;
  uint32_t pos;
  uint32_t key;
  uint32_t i;
  uint32_t *values_in_local;
  uint32_t *keys_out_local;
  uint32_t *keys_in_local;
  uint32_t mask_local;
  uint32_t shift_local;
  uint32_t *hist_local;
  
  for (i = 0; i < size; i = i + 1) {
    uVar1 = keys_in[i];
    uVar3 = uVar1 >> ((byte)shift & 0x1f) & mask;
    uVar2 = hist[uVar3];
    hist[uVar3] = uVar2 + 1;
    keys_out[uVar2] = uVar1;
    values_out[uVar2] = values_in[i];
  }
  return;
}

Assistant:

static inline void radixpass_u32(uint32_t* restrict hist, uint32_t shift, uint32_t mask,
    const uint32_t* restrict keys_in, uint32_t* restrict keys_out,
    const uint32_t* restrict values_in, uint32_t* restrict values_out, uint32_t size)
{
    for (uint32_t i = 0; i < size; ++i)
    {
        const uint32_t key = keys_in[i];
        const uint32_t pos = (key >> shift) & mask;
        const uint32_t index = hist[pos]++;
        keys_out[index] = key;
        values_out[index] = values_in[i];
    }
}